

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O1

size_t ZSTD_CCtx_setCParams(ZSTD_CCtx *cctx,ZSTD_compressionParameters cparams)

{
  ZSTD_cStreamStage ZVar1;
  size_t sVar2;
  ulong uVar3;
  
  sVar2 = ZSTD_checkCParams(cparams);
  if (sVar2 < 0xffffffffffffff89) {
    ZVar1 = cctx->streamStage;
    sVar2 = 0xffffffffffffffc4;
    if (ZVar1 == zcss_init) {
      sVar2 = 0xffffffffffffffd6;
      if (cparams.windowLog == 0 || 0xffffffe9 < cparams.windowLog - 0x20) {
        (cctx->requestedParams).cParams.windowLog = cparams.windowLog;
        sVar2 = (ulong)cparams.windowLog;
      }
    }
    if (sVar2 < 0xffffffffffffff89) {
      if (ZVar1 != zcss_init) {
        cctx->cParamsChanged = 1;
      }
      sVar2 = 0xffffffffffffffd6;
      if (cparams.chainLog == 0 || 0xffffffe6 < cparams.chainLog - 0x1f) {
        (cctx->requestedParams).cParams.chainLog = cparams.chainLog;
        sVar2 = (ulong)cparams.chainLog;
      }
      if (sVar2 < 0xffffffffffffff89) {
        if (ZVar1 != zcss_init) {
          cctx->cParamsChanged = 1;
        }
        sVar2 = 0xffffffffffffffd6;
        if (cparams.hashLog == 0 || 0xffffffe6 < cparams.hashLog - 0x1f) {
          (cctx->requestedParams).cParams.hashLog = cparams.hashLog;
          sVar2 = (ulong)cparams.hashLog;
        }
        if (sVar2 < 0xffffffffffffff89) {
          if (ZVar1 != zcss_init) {
            cctx->cParamsChanged = 1;
          }
          sVar2 = 0xffffffffffffffd6;
          if (cparams.searchLog < 0x1f) {
            (cctx->requestedParams).cParams.searchLog = cparams.searchLog;
            sVar2 = (ulong)cparams.searchLog;
          }
          if (sVar2 < 0xffffffffffffff89) {
            if (ZVar1 != zcss_init) {
              cctx->cParamsChanged = 1;
            }
            if ((cparams.minMatch - 3 < 5) || (sVar2 = 0xffffffffffffffd6, cparams.minMatch == 0)) {
              (cctx->requestedParams).cParams.minMatch = cparams.minMatch;
              sVar2 = (ulong)cparams.minMatch;
            }
            if (sVar2 < 0xffffffffffffff89) {
              if (ZVar1 != zcss_init) {
                cctx->cParamsChanged = 1;
              }
              sVar2 = 0xffffffffffffffd6;
              if (cparams.targetLength < 0x20001) {
                (cctx->requestedParams).cParams.targetLength = cparams.targetLength;
                sVar2 = (ulong)cparams.targetLength;
              }
              if (sVar2 < 0xffffffffffffff89) {
                if (ZVar1 != zcss_init) {
                  cctx->cParamsChanged = 1;
                }
                uVar3 = 0xffffffffffffffd6;
                if (cparams.strategy < (ZSTD_btultra|ZSTD_dfast)) {
                  (cctx->requestedParams).cParams.strategy = cparams.strategy;
                  uVar3 = (ulong)cparams.strategy;
                }
                sVar2 = 0;
                if (0xffffffffffffff88 < uVar3) {
                  sVar2 = uVar3;
                }
              }
            }
          }
        }
      }
    }
  }
  return sVar2;
}

Assistant:

size_t ZSTD_CCtx_setCParams(ZSTD_CCtx* cctx, ZSTD_compressionParameters cparams)
{
    ZSTD_STATIC_ASSERT(sizeof(cparams) == 7 * 4 /* all params are listed below */);
    DEBUGLOG(4, "ZSTD_CCtx_setCParams");
    /* only update if all parameters are valid */
    FORWARD_IF_ERROR(ZSTD_checkCParams(cparams), "");
    FORWARD_IF_ERROR(ZSTD_CCtx_setParameter(cctx, ZSTD_c_windowLog, cparams.windowLog), "");
    FORWARD_IF_ERROR(ZSTD_CCtx_setParameter(cctx, ZSTD_c_chainLog, cparams.chainLog), "");
    FORWARD_IF_ERROR(ZSTD_CCtx_setParameter(cctx, ZSTD_c_hashLog, cparams.hashLog), "");
    FORWARD_IF_ERROR(ZSTD_CCtx_setParameter(cctx, ZSTD_c_searchLog, cparams.searchLog), "");
    FORWARD_IF_ERROR(ZSTD_CCtx_setParameter(cctx, ZSTD_c_minMatch, cparams.minMatch), "");
    FORWARD_IF_ERROR(ZSTD_CCtx_setParameter(cctx, ZSTD_c_targetLength, cparams.targetLength), "");
    FORWARD_IF_ERROR(ZSTD_CCtx_setParameter(cctx, ZSTD_c_strategy, cparams.strategy), "");
    return 0;
}